

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparableString.hpp
# Opt level: O3

string * __thiscall
database::ComparableString::_ToLowerCase
          (string *__return_storage_ptr__,ComparableString *this,string *string)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (string->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + string->_M_string_length);
  sVar2 = __return_storage_ptr__->_M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      iVar3 = tolower((int)pcVar1[sVar4]);
      pcVar1[sVar4] = (char)iVar3;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _ToLowerCase(const std::string& string) const
    {
      std::string _string = string;
      std::transform(_string.begin(),_string.end(),_string.begin(),::tolower);
      return _string;
    }